

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

locale booster::locale::impl_icu::create_parsing(locale *in,cdata *cd,character_facet_type type)

{
  int in_ECX;
  locale *in_RSI;
  _Impl *in_RDI;
  cdata *in_stack_00000010;
  undefined4 in_stack_00000018;
  
  if (in_ECX == 1) {
    install_parsing_facets<char>((locale *)CONCAT44(type,in_stack_00000018),in_stack_00000010);
  }
  else if (in_ECX == 2) {
    install_parsing_facets<wchar_t>((locale *)CONCAT44(type,in_stack_00000018),in_stack_00000010);
  }
  else {
    std::locale::locale((locale *)in_RDI,in_RSI);
  }
  return (locale)in_RDI;
}

Assistant:

std::locale create_parsing(std::locale const &in,cdata const &cd,character_facet_type type)
{
        switch(type) {
        case char_facet:
            return install_parsing_facets<char>(in,cd);
        case wchar_t_facet:
            return install_parsing_facets<wchar_t>(in,cd);
        #ifdef BOOSTER_HAS_CHAR16_T
        case char16_t_facet:
            return install_parsing_facets<char16_t>(in,cd);
        #endif
        #ifdef BOOSTER_HAS_CHAR32_T
        case char32_t_facet:
            return install_parsing_facets<char32_t>(in,cd);
        #endif
        default:
            return in;
        }
}